

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Property::Property(Property *this)

{
  Property *this_local;
  
  Attribute::Attribute(&this->_attrib);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  Relationship::Relationship(&this->_rel);
  std::__cxx11::string::string((string *)&this->_prop_value_type_name);
  this->_has_custom = false;
  return;
}

Assistant:

Property() = default;